

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O0

bsc_step_t
bsc_bcast_1phase_multiple
          (bsc_step_t depends,bsp_pid_t root,bsc_group_t group,bsc_coll_params_t *params,
          bsc_size_t n)

{
  bsc_pid_t local_40;
  bsc_step_t local_3c;
  int local_38;
  bsc_step_t finished;
  bsc_size_t i;
  bsc_pid_t P;
  group_t *g;
  bsc_size_t n_local;
  bsc_coll_params_t *params_local;
  bsc_group_t group_local;
  bsp_pid_t root_local;
  bsc_step_t depends_local;
  
  if (group == (bsc_group_t)0x0) {
    local_40 = bsp_nprocs();
  }
  else {
    local_40 = *group;
  }
  local_3c = depends;
  for (local_38 = 0; local_38 < n; local_38 = local_38 + 1) {
    local_3c = bsc_bcast_qtree_single
                         (depends,root,group,params[local_38].src,params[local_38].dst,
                          params[local_38].size,local_40);
  }
  return local_3c;
}

Assistant:

bsc_step_t bsc_bcast_1phase_multiple( bsc_step_t depends,
                      bsp_pid_t root, bsc_group_t group, 
                      bsc_coll_params_t * params, bsc_size_t n)
{
    group_t * g = group;
    bsc_pid_t P = g?g->size:bsp_nprocs() ;
    bsc_size_t i;
    bsc_step_t finished = depends;
    for ( i = 0; i < n ; ++i ) {
        finished = bsc_bcast_qtree_single( depends, root, group,
                params[i].src, params[i].dst, params[i].size, P );
    }

    return finished;
}